

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# painter.cpp
# Opt level: O3

void __thiscall Painter::~Painter(Painter *this)

{
  this->m_stopThread = true;
  if ((this->m_draw_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Deconstruct ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_all_cmakelists_25/roamiri[P]selfOrganizedNetwork/painter.cpp"
             ,0x61);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  if ((this->m_draw_thread)._M_id._M_thread == 0) {
    std::vector<std::shared_ptr<draw_object>,_std::allocator<std::shared_ptr<draw_object>_>_>::
    ~vector(&this->m_objects);
    return;
  }
  std::terminate();
}

Assistant:

Painter::~Painter()
{
	m_stopThread = true;
	if(m_draw_thread.joinable())
		m_draw_thread.join();
	std::cout << "Deconstruct " << __FILE__ << std::endl;
}